

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.c
# Opt level: O0

void * apx_client_register_event_listener(apx_client_t *self,apx_clientEventListener_tag *listener)

{
  void *handle;
  apx_clientEventListener_tag *listener_local;
  apx_client_t *self_local;
  
  if ((self == (apx_client_t *)0x0) || (listener == (apx_clientEventListener_tag *)0x0)) {
    self_local = (apx_client_t *)0x0;
  }
  else {
    self_local = (apx_client_t *)apx_clientEventListener_clone(listener);
    if (self_local != (apx_client_t *)0x0) {
      pthread_mutex_lock((pthread_mutex_t *)&self->event_listener_lock);
      adt_list_insert(self->event_listeners,self_local);
      pthread_mutex_unlock((pthread_mutex_t *)&self->event_listener_lock);
    }
  }
  return self_local;
}

Assistant:

void* apx_client_register_event_listener(apx_client_t *self, struct apx_clientEventListener_tag *listener)
{
   if ( (self != NULL) && (listener != 0))
   {
      void *handle = (void*) apx_clientEventListener_clone(listener);
      if (handle != 0)
      {
         MUTEX_LOCK(self->event_listener_lock);
         adt_list_insert(self->event_listeners, handle);
         MUTEX_UNLOCK(self->event_listener_lock);
      }
      return handle;
   }
   return (void*) 0;
}